

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcSymTable.cpp
# Opt level: O2

bool __thiscall
GrcSymbolTableEntry::AdjustExpTypeIfPossible(GrcSymbolTableEntry *this,ExpressionType expt)

{
  ExpressionType EVar1;
  
  EVar1 = this->m_expt;
  if (EVar1 != kexptUnknown) {
    if (EVar1 == expt) {
      return true;
    }
    if ((2 < expt - kexptNumber || EVar1 != kexptZero) &&
       (1 < expt - kexptNumber || EVar1 != kexptOne)) {
      return false;
    }
  }
  this->m_expt = expt;
  return true;
}

Assistant:

bool GrcSymbolTableEntry::AdjustExpTypeIfPossible(ExpressionType expt)
{
	if (m_expt == kexptUnknown)
	{
		m_expt = expt;
		return true;
	}
	if (m_expt == expt)
	{
		return true;
	}
	if (m_expt == kexptZero && (expt == kexptNumber || expt == kexptMeas || expt == kexptBoolean))
	{
		m_expt = expt;
		return true;
	}
	if (m_expt == kexptOne && (expt == kexptNumber || expt == kexptBoolean))
	{
		m_expt = expt;
		return true;
	}
	return false;
}